

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O0

void __thiscall llvm::DWARFGdbIndex::dumpAddressArea(DWARFGdbIndex *this,raw_ostream *OS)

{
  raw_ostream *prVar1;
  unsigned_long *in_R8;
  unsigned_long local_98;
  format_object<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_int> local_90;
  const_iterator local_60;
  AddressEntry *Addr;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<llvm::DWARFGdbIndex::AddressEntry,_0U> *__range1;
  format_object<unsigned_int,_unsigned_long> local_38;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  DWARFGdbIndex *this_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  __range1 = (SmallVector<llvm::DWARFGdbIndex::AddressEntry,_0U> *)
             SmallVectorBase::size((SmallVectorBase *)&this->AddressArea);
  format<unsigned_int,unsigned_long>
            (&local_38,(llvm *)"\n  Address area offset = 0x%x, has %ld entries:",
             (char *)&this->AddressAreaOffset,(uint *)&__range1,in_R8);
  prVar1 = raw_ostream::operator<<(OS,&local_38.super_format_object_base);
  raw_ostream::operator<<(prVar1,'\n');
  __begin1 = (const_iterator)&this->AddressArea;
  __end1 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void> *)__begin1
                     );
  Addr = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>::end
                   ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void> *)__begin1);
  for (; __end1 != Addr; __end1 = __end1 + 1) {
    local_60 = __end1;
    local_98 = __end1->HighAddress - __end1->LowAddress;
    prVar1 = local_18;
    format<unsigned_long,unsigned_long,unsigned_long,unsigned_int>
              (&local_90,
               (llvm *)"    Low/High address = [0x%llx, 0x%llx) (Size: 0x%llx), CU id = %d\n",
               (char *)__end1,&__end1->HighAddress,&local_98,(unsigned_long *)&__end1->CuIndex,
               (uint *)local_18);
    raw_ostream::operator<<(prVar1,&local_90.super_format_object_base);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpAddressArea(raw_ostream &OS) const {
  OS << format("\n  Address area offset = 0x%x, has %" PRId64 " entries:",
               AddressAreaOffset, (uint64_t)AddressArea.size())
     << '\n';
  for (const AddressEntry &Addr : AddressArea)
    OS << format(
        "    Low/High address = [0x%llx, 0x%llx) (Size: 0x%llx), CU id = %d\n",
        Addr.LowAddress, Addr.HighAddress, Addr.HighAddress - Addr.LowAddress,
        Addr.CuIndex);
}